

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmGeneratedFileStream *this_00;
  string sourceFileName;
  string buildFileDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar2 = cmake::GetHomeOutputDirectory
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)&local_40,pcVar2,(allocator *)&local_c0);
  if (this->CompileCommandsStream == (cmGeneratedFileStream *)0x0) {
    std::operator+(&local_c0,&local_40,"/compile_commands.json");
    if (this->ComputingUnknownDependencies == true) {
      std::__cxx11::string::string
                ((string *)&local_80,"compile_commands.json",(allocator *)&local_60);
      NinjaOutputPath(&local_a0,this,&local_80);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CombinedBuildOutputs,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,local_c0._M_dataplus._M_p,false,None);
    this->CompileCommandsStream = this_00;
    std::operator<<((ostream *)this_00,"[");
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    poVar3 = std::operator<<((ostream *)this->CompileCommandsStream,",");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)sourceFile);
  bVar1 = cmsys::SystemTools::FileIsFullPath(local_c0._M_dataplus._M_p);
  if (!bVar1) {
    pcVar2 = cmake::GetHomeOutputDirectory
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmsys::SystemTools::CollapseFullPath(&local_a0,&local_c0,pcVar2);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  poVar3 = std::operator<<((ostream *)this->CompileCommandsStream,"\n{\n");
  poVar3 = std::operator<<(poVar3,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_a0,&local_40);
  poVar3 = std::operator<<(poVar3,(string *)&local_a0);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_80,commandLine);
  poVar3 = std::operator<<(poVar3,(string *)&local_80);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_60,&local_c0);
  poVar3 = std::operator<<(poVar3,(string *)&local_60);
  poVar3 = std::operator<<(poVar3,"\"\n");
  std::operator<<(poVar3,"}");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath = buildFileDir + "/compile_commands.json";
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      new cmGeneratedFileStream(buildFilePath.c_str());
    *this->CompileCommandsStream << "[";
  } else {
    *this->CompileCommandsStream << "," << std::endl;
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str())) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "\n{\n"
     << "  \"directory\": \""
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << "  \"command\": \""
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << "  \"file\": \""
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\"\n"
     << "}";
  /* clang-format on */
}